

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSSetJacTimesRhsFn(void *arkode_mem,ARKRhsFn jtimesRhsFn)

{
  ARKodeMem pAVar1;
  ARKodeMem in_RSI;
  void *in_RDI;
  int retval;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem *in_stack_ffffffffffffffd8;
  ARKodeMem in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = arkLs_AccessLMem(in_RSI,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                             (ARKLsMem *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (local_4 == 0) {
    if (*(int *)(in_stack_ffffffffffffffd8 + 0x1d) == 0) {
      arkProcessError(in_stack_ffffffffffffffe0,-3,"ARKLS","arkLSSetJacTimesRhsFn",
                      "Internal finite-difference Jacobian-vector product is disabled.");
      local_4 = -3;
    }
    else {
      if (in_RSI == (ARKodeMem)0x0) {
        pAVar1 = (ARKodeMem)(*in_stack_ffffffffffffffe0->step_getimplicitrhs)(in_RDI);
        in_stack_ffffffffffffffd8[0x20] = pAVar1;
        if (in_stack_ffffffffffffffd8[0x20] == (ARKodeMem)0x0) {
          arkProcessError(in_stack_ffffffffffffffe0,-3,"ARKLS","arkLSSetJacTimesRhsFn",
                          "Time step module is missing implicit RHS fcn");
          return -3;
        }
      }
      else {
        in_stack_ffffffffffffffd8[0x20] = in_RSI;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int arkLSSetJacTimesRhsFn(void *arkode_mem, ARKRhsFn jtimesRhsFn)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetJacTimesRhsFn",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* check if using internal finite difference approximation */
  if (!(arkls_mem->jtimesDQ)) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetJacTimesRhsFn",
                    "Internal finite-difference Jacobian-vector product is disabled.");
    return(ARKLS_ILL_INPUT);
  }

  /* store function pointers for RHS function (NULL implies use ODE RHS) */
  if (jtimesRhsFn != NULL) {
    arkls_mem->Jt_f = jtimesRhsFn;
  } else {
    arkls_mem->Jt_f = ark_mem->step_getimplicitrhs(arkode_mem);

    if (arkls_mem->Jt_f == NULL) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                      "arkLSSetJacTimesRhsFn",
                      "Time step module is missing implicit RHS fcn");
      return(ARKLS_ILL_INPUT);
    }
  }

  return(ARKLS_SUCCESS);
}